

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[50]>(string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                           char (*args) [50])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char (*local_20) [50];
  
  local_48._M_len = (a->View_)._M_len;
  local_48._M_str = (a->View_)._M_str;
  local_38 = (b->View_)._M_len;
  pcStack_30 = (b->View_)._M_str;
  local_28 = strlen(*args);
  views._M_len = 3;
  views._M_array = &local_48;
  local_20 = args;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}